

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P11Objects.cpp
# Opt level: O0

int __thiscall P11EDPrivateKeyObj::init(P11EDPrivateKeyObj *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  P11Attribute *this_00;
  P11Attribute *this_01;
  mapped_type *ppPVar4;
  EVP_PKEY_CTX *ctx_00;
  P11Attribute *attrValue;
  P11Attribute *attrEcParams;
  OSAttribute setKeyType;
  unsigned_long in_stack_fffffffffffffeb8;
  OSAttribute *in_stack_fffffffffffffec0;
  OSObject *in_stack_fffffffffffffec8;
  P11AttrValue *in_stack_fffffffffffffed0;
  key_type *__k;
  P11Attribute *this_02;
  undefined1 local_b8 [160];
  EVP_PKEY_CTX *local_18;
  P11EDPrivateKeyObj *local_10;
  undefined1 local_1;
  
  if (((this->super_P11PrivateKeyObj).super_P11KeyObj.super_P11Object.field_0x43 & 1) == 0) {
    if (ctx == (EVP_PKEY_CTX *)0x0) {
      local_1 = 0;
    }
    else {
      local_18 = ctx;
      local_10 = this;
      uVar2 = (**(code **)(*(long *)ctx + 0x10))(ctx,0x100);
      if (((uVar2 & 1) == 0) ||
         (lVar3 = (**(code **)(*(long *)local_18 + 0x28))(local_18,0x100,0x80000000), lVar3 != 0x40)
         ) {
        OSAttribute::OSAttribute(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        (**(code **)(*(long *)local_18 + 0x40))(local_18,0x100,local_b8);
        OSAttribute::~OSAttribute(in_stack_fffffffffffffec0);
      }
      uVar1 = P11PrivateKeyObj::init(&this->super_P11PrivateKeyObj,local_18);
      if ((uVar1 & 1) == 0) {
        local_1 = 0;
        this = (P11EDPrivateKeyObj *)(ulong)uVar1;
      }
      else {
        __k = (key_type *)0x28;
        this_00 = (P11Attribute *)operator_new(0x28);
        P11AttrEcParams::P11AttrEcParams
                  ((P11AttrEcParams *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   (CK_ULONG)in_stack_fffffffffffffec0);
        this_02 = this_00;
        this_01 = (P11Attribute *)operator_new(0x28);
        ctx_00 = (EVP_PKEY_CTX *)
                 (this->super_P11PrivateKeyObj).super_P11KeyObj.super_P11Object.osobject;
        P11AttrValue::P11AttrValue
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   (CK_ULONG)in_stack_fffffffffffffec0);
        uVar1 = P11Attribute::init(this_00,ctx_00);
        if (((uVar1 & 1) == 0) || (uVar1 = P11Attribute::init(this_01,ctx_00), (uVar1 & 1) == 0)) {
          softHSMLog(3,"init",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/P11Objects.cpp"
                     ,0x52c,"Could not initialize the attribute");
          if (this_00 != (P11Attribute *)0x0) {
            (*this_00->_vptr_P11Attribute[1])();
          }
          if (this_01 != (P11Attribute *)0x0) {
            uVar1 = (*this_01->_vptr_P11Attribute[1])();
            this_01 = (P11Attribute *)(ulong)uVar1;
          }
          local_1 = 0;
          this = (P11EDPrivateKeyObj *)this_01;
        }
        else {
          P11Attribute::getType(this_00);
          ppPVar4 = std::
                    map<unsigned_long,_P11Attribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_P11Attribute_*>_>_>
                    ::operator[]((map<unsigned_long,_P11Attribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_P11Attribute_*>_>_>
                                  *)this_02,__k);
          *ppPVar4 = this_00;
          P11Attribute::getType(this_01);
          ppPVar4 = std::
                    map<unsigned_long,_P11Attribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_P11Attribute_*>_>_>
                    ::operator[]((map<unsigned_long,_P11Attribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_P11Attribute_*>_>_>
                                  *)this_02,__k);
          *ppPVar4 = this_01;
          (this->super_P11PrivateKeyObj).super_P11KeyObj.super_P11Object.field_0x43 = 1;
          local_1 = 1;
        }
      }
    }
  }
  else {
    local_1 = 1;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool P11EDPrivateKeyObj::init(OSObject *inobject)
{
	if (initialized) return true;
	if (inobject == NULL) return false;

	if (!inobject->attributeExists(CKA_KEY_TYPE) || inobject->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_EC_EDWARDS) {
		OSAttribute setKeyType((unsigned long)CKK_EC_EDWARDS);
		inobject->setAttribute(CKA_KEY_TYPE, setKeyType);
	}

	// Create parent
	if (!P11PrivateKeyObj::init(inobject)) return false;

	// Create attributes
	P11Attribute* attrEcParams = new P11AttrEcParams(osobject,P11Attribute::ck4|P11Attribute::ck6);
	P11Attribute* attrValue = new P11AttrValue(osobject,P11Attribute::ck1|P11Attribute::ck4|P11Attribute::ck6|P11Attribute::ck7);

	// Initialize the attributes
	if
	(
		!attrEcParams->init() ||
		!attrValue->init()
	)
	{
		ERROR_MSG("Could not initialize the attribute");
		delete attrEcParams;
		delete attrValue;
		return false;
	}

	// Add them to the map
	attributes[attrEcParams->getType()] = attrEcParams;
	attributes[attrValue->getType()] = attrValue;

	initialized = true;
	return true;
}